

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O0

void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx,flatbuffers_utype_t type)

{
  flatbuffers_utype_t type_local;
  flatcc_json_printer_t *ctx_local;
  
  if (type == '\x02') {
    flatcc_json_printer_enum(ctx,"MuLan",5);
  }
  else if (type == '\b') {
    flatcc_json_printer_enum(ctx,"Rapunzel",8);
  }
  else if (type == '\t') {
    flatcc_json_printer_enum(ctx,"Belle",5);
  }
  else if (type == '\n') {
    flatcc_json_printer_enum(ctx,"BookFan",7);
  }
  else if (type == '\v') {
    flatcc_json_printer_enum(ctx,"Other",5);
  }
  else if (type == 0xff) {
    flatcc_json_printer_enum(ctx,"Unused",6);
  }
  else {
    flatcc_json_printer_enum(ctx,"NONE",4);
  }
  return;
}

Assistant:

static void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx, flatbuffers_utype_t type)
{
    switch (type) {
    case 2:
        flatcc_json_printer_enum(ctx, "MuLan", 5);
        break;
    case 8:
        flatcc_json_printer_enum(ctx, "Rapunzel", 8);
        break;
    case 9:
        flatcc_json_printer_enum(ctx, "Belle", 5);
        break;
    case 10:
        flatcc_json_printer_enum(ctx, "BookFan", 7);
        break;
    case 11:
        flatcc_json_printer_enum(ctx, "Other", 5);
        break;
    case 255:
        flatcc_json_printer_enum(ctx, "Unused", 6);
        break;
    default:
        flatcc_json_printer_enum(ctx, "NONE", 4);
        break;
    }
}